

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

void universal_action(Architecture *conf)

{
  AddrSpace *ss;
  pointer ppRVar1;
  ActionRestartGroup *this;
  Action *pAVar2;
  ActionExtraPopSetup *this_00;
  ActionGroup *pAVar3;
  ActionGroup *this_01;
  ActionSegmentize *this_02;
  ActionDirectWrite *pAVar4;
  ActionRestructureVarnode *this_03;
  ActionInferTypes *this_04;
  ActionPool *pAVar5;
  Rule *pRVar6;
  RulePtrFlow *this_05;
  RuleSubvarSext *this_06;
  ActionStackPtrFlow *this_07;
  ActionConstantPtr *this_08;
  pointer ppRVar7;
  allocator local_69;
  string local_68;
  ActionGroup *local_48;
  ActionGroup *local_40;
  AddrSpace *local_38;
  
  ss = (conf->super_AddrSpaceManager).stackspace;
  build_defaultactions(&conf->allacts);
  this = (ActionRestartGroup *)operator_new(0x90);
  std::__cxx11::string::string((string *)&local_68,"universal",&local_69);
  ActionRestartGroup::ActionRestartGroup(this,8,&local_68,1);
  std::__cxx11::string::~string((string *)&local_68);
  ActionDatabase::registerUniversal(&conf->allacts,(Action *)this);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionStart::ActionStart((ActionStart *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionConstbase::ActionConstbase((ActionConstbase *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"normalanalysis",&local_69);
  ActionNormalizeSetup::ActionNormalizeSetup((ActionNormalizeSetup *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionDefaultParams::ActionDefaultParams((ActionDefaultParams *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  this_00 = (ActionExtraPopSetup *)operator_new(0x70);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionExtraPopSetup::ActionExtraPopSetup(this_00,&local_68,ss);
  ActionGroup::addAction((ActionGroup *)this,(Action *)this_00);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"protorecovery",&local_69);
  ActionPrototypeTypes::ActionPrototypeTypes((ActionPrototypeTypes *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"protorecovery",&local_69);
  ActionFuncLink::ActionFuncLink((ActionFuncLink *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"noproto",&local_69);
  ActionFuncLinkOutOnly::ActionFuncLinkOutOnly((ActionFuncLinkOutOnly *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar3 = (ActionGroup *)operator_new(0x88);
  std::__cxx11::string::string((string *)&local_68,"fullloop",&local_69);
  local_38 = ss;
  ActionGroup::ActionGroup(pAVar3,4,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  this_01 = (ActionGroup *)operator_new(0x88);
  std::__cxx11::string::string((string *)&local_68,"mainloop",&local_69);
  ActionGroup::ActionGroup(this_01,4,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionUnreachable::ActionUnreachable((ActionUnreachable *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionVarnodeProps::ActionVarnodeProps((ActionVarnodeProps *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionHeritage::ActionHeritage((ActionHeritage *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"protorecovery",&local_69);
  ActionParamDouble::ActionParamDouble((ActionParamDouble *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  this_02 = (ActionSegmentize *)operator_new(0x70);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionSegmentize::ActionSegmentize(this_02,&local_68);
  ActionGroup::addAction(this_01,(Action *)this_02);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"blockrecovery",&local_69);
  ActionForceGoto::ActionForceGoto((ActionForceGoto *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  local_40 = pAVar3;
  std::__cxx11::string::~string((string *)&local_68);
  pAVar4 = (ActionDirectWrite *)operator_new(0x70);
  std::__cxx11::string::string((string *)&local_68,"protorecovery_a",&local_69);
  ActionDirectWrite::ActionDirectWrite(pAVar4,&local_68,true);
  ActionGroup::addAction(this_01,(Action *)pAVar4);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar4 = (ActionDirectWrite *)operator_new(0x70);
  std::__cxx11::string::string((string *)&local_68,"protorecovery_b",&local_69);
  ActionDirectWrite::ActionDirectWrite(pAVar4,&local_68,false);
  ActionGroup::addAction(this_01,(Action *)pAVar4);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"protorecovery",&local_69);
  ActionActiveParam::ActionActiveParam((ActionActiveParam *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"protorecovery",&local_69);
  ActionReturnRecovery::ActionReturnRecovery((ActionReturnRecovery *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"localrecovery",&local_69);
  ActionRestrictLocal::ActionRestrictLocal((ActionRestrictLocal *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"deadcode",&local_69);
  ActionDeadCode::ActionDeadCode((ActionDeadCode *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"dynamic",&local_69);
  ActionDynamicMapping::ActionDynamicMapping((ActionDynamicMapping *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  this_03 = (ActionRestructureVarnode *)operator_new(0x70);
  std::__cxx11::string::string((string *)&local_68,"localrecovery",&local_69);
  ActionRestructureVarnode::ActionRestructureVarnode(this_03,&local_68);
  ActionGroup::addAction(this_01,(Action *)this_03);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionSpacebase::ActionSpacebase((ActionSpacebase *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  ActionNonzeroMask::ActionNonzeroMask((ActionNonzeroMask *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  this_04 = (ActionInferTypes *)operator_new(0x70);
  std::__cxx11::string::string((string *)&local_68,"typerecovery",&local_69);
  ActionInferTypes::ActionInferTypes(this_04,&local_68);
  ActionGroup::addAction(this_01,(Action *)this_04);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar3 = (ActionGroup *)operator_new(0x88);
  std::__cxx11::string::string((string *)&local_68,"stackstall",&local_69);
  local_48 = pAVar3;
  ActionGroup::ActionGroup(pAVar3,4,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar5 = (ActionPool *)operator_new(0x768);
  std::__cxx11::string::string((string *)&local_68,"oppool1",&local_69);
  ActionPool::ActionPool(pAVar5,4,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"deadcode",&local_69);
  RuleEarlyRemoval::RuleEarlyRemoval((RuleEarlyRemoval *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleTermOrder::RuleTermOrder((RuleTermOrder *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSelectCse::RuleSelectCse((RuleSelectCse *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleCollectTerms::RuleCollectTerms((RuleCollectTerms *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RulePullsubMulti::RulePullsubMulti((RulePullsubMulti *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RulePullsubIndirect::RulePullsubIndirect((RulePullsubIndirect *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"nodejoin",&local_69);
  RulePushMulti::RulePushMulti((RulePushMulti *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSborrow::RuleSborrow((RuleSborrow *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleIntLessEqual::RuleIntLessEqual((RuleIntLessEqual *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleTrivialArith::RuleTrivialArith((RuleTrivialArith *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleTrivialBool::RuleTrivialBool((RuleTrivialBool *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleTrivialShift::RuleTrivialShift((RuleTrivialShift *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSignShift::RuleSignShift((RuleSignShift *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleTestSign::RuleTestSign((RuleTestSign *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleIdentityEl::RuleIdentityEl((RuleIdentityEl *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleOrMask::RuleOrMask((RuleOrMask *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleAndMask::RuleAndMask((RuleAndMask *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleOrConsume::RuleOrConsume((RuleOrConsume *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleOrCollapse::RuleOrCollapse((RuleOrCollapse *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleAndOrLump::RuleAndOrLump((RuleAndOrLump *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleShiftBitops::RuleShiftBitops((RuleShiftBitops *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleRightShiftAnd::RuleRightShiftAnd((RuleRightShiftAnd *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleNotDistribute::RuleNotDistribute((RuleNotDistribute *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleHighOrderAnd::RuleHighOrderAnd((RuleHighOrderAnd *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleAndDistribute::RuleAndDistribute((RuleAndDistribute *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleAndCommute::RuleAndCommute((RuleAndCommute *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleAndPiece::RuleAndPiece((RuleAndPiece *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleAndCompare::RuleAndCompare((RuleAndCompare *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleDoubleSub::RuleDoubleSub((RuleDoubleSub *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleDoubleShift::RuleDoubleShift((RuleDoubleShift *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleDoubleArithShift::RuleDoubleArithShift((RuleDoubleArithShift *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleConcatShift::RuleConcatShift((RuleConcatShift *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleLeftRight::RuleLeftRight((RuleLeftRight *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleShiftCompare::RuleShiftCompare((RuleShiftCompare *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleShift2Mult::RuleShift2Mult((RuleShift2Mult *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleShiftPiece::RuleShiftPiece((RuleShiftPiece *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleMultiCollapse::RuleMultiCollapse((RuleMultiCollapse *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleIndirectCollapse::RuleIndirectCollapse((RuleIndirectCollapse *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  Rule2Comp2Mult::Rule2Comp2Mult((Rule2Comp2Mult *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSub2Add::RuleSub2Add((RuleSub2Add *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleCarryElim::RuleCarryElim((RuleCarryElim *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleBxor2NotEqual::RuleBxor2NotEqual((RuleBxor2NotEqual *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleLess2Zero::RuleLess2Zero((RuleLess2Zero *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleLessEqual2Zero::RuleLessEqual2Zero((RuleLessEqual2Zero *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSLess2Zero::RuleSLess2Zero((RuleSLess2Zero *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleEqual2Zero::RuleEqual2Zero((RuleEqual2Zero *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleEqual2Constant::RuleEqual2Constant((RuleEqual2Constant *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleThreeWayCompare::RuleThreeWayCompare((RuleThreeWayCompare *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleXorCollapse::RuleXorCollapse((RuleXorCollapse *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleAddMultCollapse::RuleAddMultCollapse((RuleAddMultCollapse *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleCollapseConstants::RuleCollapseConstants((RuleCollapseConstants *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleTransformCpool::RuleTransformCpool((RuleTransformCpool *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RulePropagateCopy::RulePropagateCopy((RulePropagateCopy *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleZextEliminate::RuleZextEliminate((RuleZextEliminate *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSlessToLess::RuleSlessToLess((RuleSlessToLess *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleZextSless::RuleZextSless((RuleZextSless *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleBitUndistribute::RuleBitUndistribute((RuleBitUndistribute *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleBoolZext::RuleBoolZext((RuleBoolZext *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleBooleanNegate::RuleBooleanNegate((RuleBooleanNegate *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleLogic2Bool::RuleLogic2Bool((RuleLogic2Bool *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSubExtComm::RuleSubExtComm((RuleSubExtComm *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSubCommute::RuleSubCommute((RuleSubCommute *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleConcatCommute::RuleConcatCommute((RuleConcatCommute *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleConcatZext::RuleConcatZext((RuleConcatZext *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleZextCommute::RuleZextCommute((RuleZextCommute *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleZextShiftZext::RuleZextShiftZext((RuleZextShiftZext *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleShiftAnd::RuleShiftAnd((RuleShiftAnd *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleConcatZero::RuleConcatZero((RuleConcatZero *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleConcatLeftShift::RuleConcatLeftShift((RuleConcatLeftShift *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleEmbed::RuleEmbed((RuleEmbed *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSubZext::RuleSubZext((RuleSubZext *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSubCancel::RuleSubCancel((RuleSubCancel *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleShiftSub::RuleShiftSub((RuleShiftSub *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleHumptyDumpty::RuleHumptyDumpty((RuleHumptyDumpty *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleDumptyHump::RuleDumptyHump((RuleDumptyHump *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleHumptyOr::RuleHumptyOr((RuleHumptyOr *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleNegateIdentity::RuleNegateIdentity((RuleNegateIdentity *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSubNormal::RuleSubNormal((RuleSubNormal *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RulePositiveDiv::RulePositiveDiv((RulePositiveDiv *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleDivTermAdd::RuleDivTermAdd((RuleDivTermAdd *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleDivTermAdd2::RuleDivTermAdd2((RuleDivTermAdd2 *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleDivOpt::RuleDivOpt((RuleDivOpt *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSignForm::RuleSignForm((RuleSignForm *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSignDiv2::RuleSignDiv2((RuleSignDiv2 *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSignNearMult::RuleSignNearMult((RuleSignNearMult *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleModOpt::RuleModOpt((RuleModOpt *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleSwitchSingle::RuleSwitchSingle((RuleSwitchSingle *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleCondNegate::RuleCondNegate((RuleCondNegate *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleBoolNegate::RuleBoolNegate((RuleBoolNegate *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleLessEqual::RuleLessEqual((RuleLessEqual *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleLessNotEqual::RuleLessNotEqual((RuleLessNotEqual *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleLessOne::RuleLessOne((RuleLessOne *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleRangeMeld::RuleRangeMeld((RuleRangeMeld *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleFloatRange::RuleFloatRange((RuleFloatRange *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RulePiece2Zext::RulePiece2Zext((RulePiece2Zext *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RulePiece2Sext::RulePiece2Sext((RulePiece2Sext *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"subvar",&local_69);
  RuleSubvarAnd::RuleSubvarAnd((RuleSubvarAnd *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"subvar",&local_69);
  RuleSubvarSubpiece::RuleSubvarSubpiece((RuleSubvarSubpiece *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"subvar",&local_69);
  RuleSplitFlow::RuleSplitFlow((RuleSplitFlow *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  this_05 = (RulePtrFlow *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"subvar",&local_69);
  RulePtrFlow::RulePtrFlow(this_05,&local_68,conf);
  ActionPool::addRule(pAVar5,(Rule *)this_05);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"subvar",&local_69);
  RuleSubvarCompZero::RuleSubvarCompZero((RuleSubvarCompZero *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"subvar",&local_69);
  RuleSubvarShift::RuleSubvarShift((RuleSubvarShift *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"subvar",&local_69);
  RuleSubvarZext::RuleSubvarZext((RuleSubvarZext *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  this_06 = (RuleSubvarSext *)operator_new(0x60);
  std::__cxx11::string::string((string *)&local_68,"subvar",&local_69);
  RuleSubvarSext::RuleSubvarSext(this_06,&local_68);
  ActionPool::addRule(pAVar5,(Rule *)this_06);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleNegateNegate::RuleNegateNegate((RuleNegateNegate *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"conditionalexe",&local_69);
  RuleConditionalMove::RuleConditionalMove((RuleConditionalMove *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"conditionalexe",&local_69);
  RuleOrPredicate::RuleOrPredicate((RuleOrPredicate *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  RuleFuncPtrEncoding::RuleFuncPtrEncoding((RuleFuncPtrEncoding *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"floatprecision",&local_69);
  RuleSubfloatConvert::RuleSubfloatConvert((RuleSubfloatConvert *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"floatprecision",&local_69);
  RuleFloatCast::RuleFloatCast((RuleFloatCast *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"floatprecision",&local_69);
  RuleIgnoreNan::RuleIgnoreNan((RuleIgnoreNan *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"typerecovery",&local_69);
  RulePtraddUndo::RulePtraddUndo((RulePtraddUndo *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"typerecovery",&local_69);
  RulePtrsubUndo::RulePtrsubUndo((RulePtrsubUndo *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"segment",&local_69);
  RuleSegment::RuleSegment((RuleSegment *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"doubleload",&local_69);
  RuleDoubleLoad::RuleDoubleLoad((RuleDoubleLoad *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"doubleprecis",&local_69);
  RuleDoubleIn::RuleDoubleIn((RuleDoubleIn *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  for (ppRVar7 = (conf->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar7 !=
      (conf->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppRVar7 = ppRVar7 + 1) {
    ActionPool::addRule(pAVar5,*ppRVar7);
  }
  ppRVar1 = (conf->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar7 != ppRVar1) {
    (conf->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar1;
  }
  ActionGroup::addAction(local_48,(Action *)pAVar5);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  ActionMultiCse::ActionMultiCse((ActionMultiCse *)pAVar2,&local_68);
  pAVar3 = local_48;
  ActionGroup::addAction(local_48,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  ActionShadowVar::ActionShadowVar((ActionShadowVar *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"deindirect",&local_69);
  ActionDeindirect::ActionDeindirect((ActionDeindirect *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  this_07 = (ActionStackPtrFlow *)operator_new(0x78);
  std::__cxx11::string::string((string *)&local_68,"stackptrflow",&local_69);
  ActionStackPtrFlow::ActionStackPtrFlow(this_07,&local_68,local_38);
  ActionGroup::addAction(pAVar3,(Action *)this_07);
  std::__cxx11::string::~string((string *)&local_68);
  ActionGroup::addAction(this_01,&pAVar3->super_Action);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"deadcontrolflow",&local_69);
  ActionRedundBranch::ActionRedundBranch((ActionRedundBranch *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"blockrecovery",&local_69);
  ActionBlockStructure::ActionBlockStructure((ActionBlockStructure *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  this_08 = (ActionConstantPtr *)operator_new(0x70);
  std::__cxx11::string::string((string *)&local_68,"typerecovery",&local_69);
  ActionConstantPtr::ActionConstantPtr(this_08,&local_68);
  ActionGroup::addAction(this_01,(Action *)this_08);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar5 = (ActionPool *)operator_new(0x768);
  std::__cxx11::string::string((string *)&local_68,"oppool2",&local_69);
  ActionPool::ActionPool(pAVar5,4,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"typerecovery",&local_69);
  RulePushPtr::RulePushPtr((RulePushPtr *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"typerecovery",&local_69);
  RuleStructOffset0::RuleStructOffset0((RuleStructOffset0 *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"typerecovery",&local_69);
  RulePtrArith::RulePtrArith((RulePtrArith *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"stackvars",&local_69);
  RuleLoadVarnode::RuleLoadVarnode((RuleLoadVarnode *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"stackvars",&local_69);
  RuleStoreVarnode::RuleStoreVarnode((RuleStoreVarnode *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  ActionGroup::addAction(this_01,(Action *)pAVar5);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"unreachable",&local_69);
  ActionDeterminedBranch::ActionDeterminedBranch((ActionDeterminedBranch *)pAVar2,&local_68);
  pAVar3 = local_40;
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"unreachable",&local_69);
  ActionUnreachable::ActionUnreachable((ActionUnreachable *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"nodejoin",&local_69);
  ActionNodeJoin::ActionNodeJoin((ActionNodeJoin *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"conditionalexe",&local_69);
  ActionConditionalExe::ActionConditionalExe((ActionConditionalExe *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"analysis",&local_69);
  ActionConditionalConst::ActionConditionalConst((ActionConditionalConst *)pAVar2,&local_68);
  ActionGroup::addAction(this_01,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  ActionGroup::addAction(pAVar3,(Action *)this_01);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"protorecovery",&local_69);
  ActionLikelyTrash::ActionLikelyTrash((ActionLikelyTrash *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar4 = (ActionDirectWrite *)operator_new(0x70);
  std::__cxx11::string::string((string *)&local_68,"protorecovery_a",&local_69);
  ActionDirectWrite::ActionDirectWrite(pAVar4,&local_68,true);
  ActionGroup::addAction(pAVar3,(Action *)pAVar4);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar4 = (ActionDirectWrite *)operator_new(0x70);
  std::__cxx11::string::string((string *)&local_68,"protorecovery_b",&local_69);
  ActionDirectWrite::ActionDirectWrite(pAVar4,&local_68,false);
  ActionGroup::addAction(pAVar3,(Action *)pAVar4);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"deadcode",&local_69);
  ActionDeadCode::ActionDeadCode((ActionDeadCode *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"deadcontrolflow",&local_69);
  ActionDoNothing::ActionDoNothing((ActionDoNothing *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"switchnorm",&local_69);
  ActionSwitchNorm::ActionSwitchNorm((ActionSwitchNorm *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"returnsplit",&local_69);
  ActionReturnSplit::ActionReturnSplit((ActionReturnSplit *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"protorecovery",&local_69);
  ActionUnjustifiedParams::ActionUnjustifiedParams((ActionUnjustifiedParams *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"typerecovery",&local_69);
  ActionStartTypes::ActionStartTypes((ActionStartTypes *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"protorecovery",&local_69);
  ActionActiveReturn::ActionActiveReturn((ActionActiveReturn *)pAVar2,&local_68);
  ActionGroup::addAction(pAVar3,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  ActionGroup::addAction((ActionGroup *)this,&pAVar3->super_Action);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"cleanup",&local_69);
  ActionStartCleanUp::ActionStartCleanUp((ActionStartCleanUp *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar5 = (ActionPool *)operator_new(0x768);
  std::__cxx11::string::string((string *)&local_68,"cleanup",&local_69);
  ActionPool::ActionPool(pAVar5,4,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"cleanup",&local_69);
  RuleMultNegOne::RuleMultNegOne((RuleMultNegOne *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"cleanup",&local_69);
  RuleAddUnsigned::RuleAddUnsigned((RuleAddUnsigned *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"cleanup",&local_69);
  Rule2Comp2Sub::Rule2Comp2Sub((Rule2Comp2Sub *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"cleanup",&local_69);
  RuleSubRight::RuleSubRight((RuleSubRight *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  pRVar6 = (Rule *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_68,"cleanup",&local_69);
  RulePtrsubCharConstant::RulePtrsubCharConstant((RulePtrsubCharConstant *)pRVar6,&local_68);
  ActionPool::addRule(pAVar5,pRVar6);
  std::__cxx11::string::~string((string *)&local_68);
  ActionGroup::addAction((ActionGroup *)this,(Action *)pAVar5);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"blockrecovery",&local_69);
  ActionPreferComplement::ActionPreferComplement((ActionPreferComplement *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"normalizebranches",&local_69);
  ActionNormalizeBranches::ActionNormalizeBranches((ActionNormalizeBranches *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionAssignHigh::ActionAssignHigh((ActionAssignHigh *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionMergeRequired::ActionMergeRequired((ActionMergeRequired *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionMarkExplicit::ActionMarkExplicit((ActionMarkExplicit *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionMarkImplied::ActionMarkImplied((ActionMarkImplied *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionMergeCopy::ActionMergeCopy((ActionMergeCopy *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionDominantCopy::ActionDominantCopy((ActionDominantCopy *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionMarkIndirectOnly::ActionMarkIndirectOnly((ActionMarkIndirectOnly *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionMergeAdjacent::ActionMergeAdjacent((ActionMergeAdjacent *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionMergeType::ActionMergeType((ActionMergeType *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionHideShadow::ActionHideShadow((ActionHideShadow *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionCopyMarker::ActionCopyMarker((ActionCopyMarker *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"localrecovery",&local_69);
  ActionOutputPrototype::ActionOutputPrototype((ActionOutputPrototype *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"fixateproto",&local_69);
  ActionInputPrototype::ActionInputPrototype((ActionInputPrototype *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"localrecovery",&local_69);
  ActionRestructureHigh::ActionRestructureHigh((ActionRestructureHigh *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"fixateglobals",&local_69);
  ActionMapGlobals::ActionMapGlobals((ActionMapGlobals *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"dynamic",&local_69);
  ActionDynamicSymbols::ActionDynamicSymbols((ActionDynamicSymbols *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"merge",&local_69);
  ActionNameVars::ActionNameVars((ActionNameVars *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"casts",&local_69);
  ActionSetCasts::ActionSetCasts((ActionSetCasts *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"blockrecovery",&local_69);
  ActionFinalStructure::ActionFinalStructure((ActionFinalStructure *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"protorecovery",&local_69);
  ActionPrototypeWarnings::ActionPrototypeWarnings((ActionPrototypeWarnings *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar2 = (Action *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_68,"base",&local_69);
  ActionStop::ActionStop((ActionStop *)pAVar2,&local_68);
  ActionGroup::addAction((ActionGroup *)this,pAVar2);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void universal_action(Architecture *conf)

{
  vector<Rule *>::iterator iter;
  ActionGroup *act;
  ActionGroup *actmainloop;
  ActionGroup *actfullloop;
  ActionPool *actprop,*actprop2;
  ActionPool *actcleanup;
  ActionGroup *actstackstall;
  AddrSpace *stackspace = conf->getStackSpace();

  build_defaultactions(conf->allacts);
  act = new ActionRestartGroup(Action::rule_onceperfunc,"universal",1);
  conf->allacts.registerUniversal(act);

  act->addAction( new ActionStart("base"));
  act->addAction( new ActionConstbase("base"));
  act->addAction( new ActionNormalizeSetup("normalanalysis"));
  act->addAction( new ActionDefaultParams("base"));
  //  act->addAction( new ActionParamShiftStart("paramshift") );
  act->addAction( new ActionExtraPopSetup("base",stackspace) );
  act->addAction( new ActionPrototypeTypes("protorecovery"));
  act->addAction( new ActionFuncLink("protorecovery") );
  act->addAction( new ActionFuncLinkOutOnly("noproto") );
  {
    actfullloop = new ActionGroup(Action::rule_repeatapply,"fullloop");
    {
      actmainloop = new ActionGroup(Action::rule_repeatapply,"mainloop");
      actmainloop->addAction( new ActionUnreachable("base") );
      actmainloop->addAction( new ActionVarnodeProps("base") );
      actmainloop->addAction( new ActionHeritage("base") );
      actmainloop->addAction( new ActionParamDouble("protorecovery") );
      actmainloop->addAction( new ActionSegmentize("base"));
      actmainloop->addAction( new ActionForceGoto("blockrecovery") );
      actmainloop->addAction( new ActionDirectWrite("protorecovery_a", true) );
      actmainloop->addAction( new ActionDirectWrite("protorecovery_b", false) );
      actmainloop->addAction( new ActionActiveParam("protorecovery") );
      actmainloop->addAction( new ActionReturnRecovery("protorecovery") );
      //      actmainloop->addAction( new ActionParamShiftStop("paramshift") );
      actmainloop->addAction( new ActionRestrictLocal("localrecovery") ); // Do before dead code removed
      actmainloop->addAction( new ActionDeadCode("deadcode") );
      actmainloop->addAction( new ActionDynamicMapping("dynamic") ); // Must come before restructurevarnode and infertypes
      actmainloop->addAction( new ActionRestructureVarnode("localrecovery") );
      actmainloop->addAction( new ActionSpacebase("base") );	// Must come before infertypes and nonzeromask
      actmainloop->addAction( new ActionNonzeroMask("analysis") );
      actmainloop->addAction( new ActionInferTypes("typerecovery") );
      actstackstall = new ActionGroup(Action::rule_repeatapply,"stackstall");
      {
	actprop = new ActionPool(Action::rule_repeatapply,"oppool1");
	actprop->addRule( new RuleEarlyRemoval("deadcode"));
	actprop->addRule( new RuleTermOrder("analysis"));
	actprop->addRule( new RuleSelectCse("analysis"));
	actprop->addRule( new RuleCollectTerms("analysis"));
	actprop->addRule( new RulePullsubMulti("analysis"));
	actprop->addRule( new RulePullsubIndirect("analysis"));
	actprop->addRule( new RulePushMulti("nodejoin"));
	actprop->addRule( new RuleSborrow("analysis") );
	actprop->addRule( new RuleIntLessEqual("analysis") );
	actprop->addRule( new RuleTrivialArith("analysis") );
	actprop->addRule( new RuleTrivialBool("analysis") );
	actprop->addRule( new RuleTrivialShift("analysis") );
	actprop->addRule( new RuleSignShift("analysis") );
	actprop->addRule( new RuleTestSign("analysis") );
	actprop->addRule( new RuleIdentityEl("analysis") );
	actprop->addRule( new RuleOrMask("analysis") );
	actprop->addRule( new RuleAndMask("analysis") );
	actprop->addRule( new RuleOrConsume("analysis") );
	actprop->addRule( new RuleOrCollapse("analysis") );
	actprop->addRule( new RuleAndOrLump("analysis") );
	actprop->addRule( new RuleShiftBitops("analysis") );
	actprop->addRule( new RuleRightShiftAnd("analysis") );
	actprop->addRule( new RuleNotDistribute("analysis") );
	actprop->addRule( new RuleHighOrderAnd("analysis") );
	actprop->addRule( new RuleAndDistribute("analysis") );
	actprop->addRule( new RuleAndCommute("analysis") );
	actprop->addRule( new RuleAndPiece("analysis") );
	actprop->addRule( new RuleAndCompare("analysis") );
	actprop->addRule( new RuleDoubleSub("analysis") );
	actprop->addRule( new RuleDoubleShift("analysis") );
	actprop->addRule( new RuleDoubleArithShift("analysis") );
	actprop->addRule( new RuleConcatShift("analysis") );
	actprop->addRule( new RuleLeftRight("analysis") );
	actprop->addRule( new RuleShiftCompare("analysis") );
	actprop->addRule( new RuleShift2Mult("analysis") );
	actprop->addRule( new RuleShiftPiece("analysis") );
	actprop->addRule( new RuleMultiCollapse("analysis") );
	actprop->addRule( new RuleIndirectCollapse("analysis") );
	actprop->addRule( new Rule2Comp2Mult("analysis") );
	actprop->addRule( new RuleSub2Add("analysis") );
	actprop->addRule( new RuleCarryElim("analysis") );
	actprop->addRule( new RuleBxor2NotEqual("analysis") );
	actprop->addRule( new RuleLess2Zero("analysis") );
	actprop->addRule( new RuleLessEqual2Zero("analysis") );
	actprop->addRule( new RuleSLess2Zero("analysis") );
	actprop->addRule( new RuleEqual2Zero("analysis") );
	actprop->addRule( new RuleEqual2Constant("analysis") );
	actprop->addRule( new RuleThreeWayCompare("analysis") );
	actprop->addRule( new RuleXorCollapse("analysis") );
	actprop->addRule( new RuleAddMultCollapse("analysis") );
	actprop->addRule( new RuleCollapseConstants("analysis") );
	actprop->addRule( new RuleTransformCpool("analysis") );
	actprop->addRule( new RulePropagateCopy("analysis") );
	actprop->addRule( new RuleZextEliminate("analysis") );
	actprop->addRule( new RuleSlessToLess("analysis") );
	actprop->addRule( new RuleZextSless("analysis") );
	actprop->addRule( new RuleBitUndistribute("analysis") );
	actprop->addRule( new RuleBoolZext("analysis") );
	actprop->addRule( new RuleBooleanNegate("analysis") );
	actprop->addRule( new RuleLogic2Bool("analysis") );
	actprop->addRule( new RuleSubExtComm("analysis") );
	actprop->addRule( new RuleSubCommute("analysis") );
	actprop->addRule( new RuleConcatCommute("analysis") );
	actprop->addRule( new RuleConcatZext("analysis") );
	actprop->addRule( new RuleZextCommute("analysis") );
	actprop->addRule( new RuleZextShiftZext("analysis") );
	actprop->addRule( new RuleShiftAnd("analysis") );
	actprop->addRule( new RuleConcatZero("analysis") );
	actprop->addRule( new RuleConcatLeftShift("analysis") );
	actprop->addRule( new RuleEmbed("analysis") );
	actprop->addRule( new RuleSubZext("analysis") );
	actprop->addRule( new RuleSubCancel("analysis") );
	actprop->addRule( new RuleShiftSub("analysis") );
	actprop->addRule( new RuleHumptyDumpty("analysis") );
	actprop->addRule( new RuleDumptyHump("analysis") );
	actprop->addRule( new RuleHumptyOr("analysis") );
	actprop->addRule( new RuleNegateIdentity("analysis") );
	actprop->addRule( new RuleSubNormal("analysis") );
	actprop->addRule( new RulePositiveDiv("analysis") );
	actprop->addRule( new RuleDivTermAdd("analysis") );
	actprop->addRule( new RuleDivTermAdd2("analysis") );
	actprop->addRule( new RuleDivOpt("analysis") );
	actprop->addRule( new RuleSignForm("analysis") );
	actprop->addRule( new RuleSignDiv2("analysis") );
	actprop->addRule( new RuleSignNearMult("analysis") );
	actprop->addRule( new RuleModOpt("analysis") );
	actprop->addRule( new RuleSwitchSingle("analysis") );
	actprop->addRule( new RuleCondNegate("analysis") );
	actprop->addRule( new RuleBoolNegate("analysis") );
	actprop->addRule( new RuleLessEqual("analysis") );
	actprop->addRule( new RuleLessNotEqual("analysis") );
	actprop->addRule( new RuleLessOne("analysis") );
	actprop->addRule( new RuleRangeMeld("analysis") );
	actprop->addRule( new RuleFloatRange("analysis") );
	actprop->addRule( new RulePiece2Zext("analysis") );
	actprop->addRule( new RulePiece2Sext("analysis") );
	actprop->addRule( new RuleSubvarAnd("subvar") );
	actprop->addRule( new RuleSubvarSubpiece("subvar") );
	actprop->addRule( new RuleSplitFlow("subvar") );
	actprop->addRule( new RulePtrFlow("subvar",conf) );
	actprop->addRule( new RuleSubvarCompZero("subvar") );
	actprop->addRule( new RuleSubvarShift("subvar") );
	actprop->addRule( new RuleSubvarZext("subvar") );
	actprop->addRule( new RuleSubvarSext("subvar") );
	actprop->addRule( new RuleNegateNegate("analysis") );
	actprop->addRule( new RuleConditionalMove("conditionalexe") );
	actprop->addRule( new RuleOrPredicate("conditionalexe") );
	actprop->addRule( new RuleFuncPtrEncoding("analysis") );
	actprop->addRule( new RuleSubfloatConvert("floatprecision") );
	actprop->addRule( new RuleFloatCast("floatprecision") );
	actprop->addRule( new RuleIgnoreNan("floatprecision") );
	actprop->addRule( new RulePtraddUndo("typerecovery") );
	actprop->addRule( new RulePtrsubUndo("typerecovery") );
	actprop->addRule( new RuleSegment("segment") );

	actprop->addRule( new RuleDoubleLoad("doubleload") );
	actprop->addRule( new RuleDoubleIn("doubleprecis") );
	for(iter=conf->extra_pool_rules.begin();iter!=conf->extra_pool_rules.end();++iter)
	  actprop->addRule( *iter ); // Add CPU specific rules
	conf->extra_pool_rules.clear(); // Rules are now absorbed into universal
      }
      actstackstall->addAction( actprop );
      actstackstall->addAction( new ActionMultiCse("analysis") );
      actstackstall->addAction( new ActionShadowVar("analysis") );
      actstackstall->addAction( new ActionDeindirect("deindirect") );
      actstackstall->addAction( new ActionStackPtrFlow("stackptrflow",stackspace));
      actmainloop->addAction( actstackstall );
      actmainloop->addAction( new ActionRedundBranch("deadcontrolflow") ); // dead code removal
      actmainloop->addAction( new ActionBlockStructure("blockrecovery"));
      actmainloop->addAction( new ActionConstantPtr("typerecovery") );
      {
	actprop2 = new ActionPool(Action::rule_repeatapply,"oppool2");

	actprop2->addRule( new RulePushPtr("typerecovery") );
	actprop2->addRule( new RuleStructOffset0("typerecovery") );
	actprop2->addRule( new RulePtrArith("typerecovery") );
	//	actprop2->addRule( new RuleIndirectConcat("analysis") );
	actprop2->addRule( new RuleLoadVarnode("stackvars") );
	actprop2->addRule( new RuleStoreVarnode("stackvars") );
      }
      actmainloop->addAction( actprop2 );
      actmainloop->addAction( new ActionDeterminedBranch("unreachable") );
      actmainloop->addAction( new ActionUnreachable("unreachable") );
      actmainloop->addAction( new ActionNodeJoin("nodejoin") );
      actmainloop->addAction( new ActionConditionalExe("conditionalexe") );
      actmainloop->addAction( new ActionConditionalConst("analysis") );
    }
    actfullloop->addAction( actmainloop );
    actfullloop->addAction( new ActionLikelyTrash("protorecovery") );
    actfullloop->addAction( new ActionDirectWrite("protorecovery_a", true) );
    actfullloop->addAction( new ActionDirectWrite("protorecovery_b", false) );
    actfullloop->addAction( new ActionDeadCode("deadcode") );
    actfullloop->addAction( new ActionDoNothing("deadcontrolflow") );
    actfullloop->addAction( new ActionSwitchNorm("switchnorm") );
    actfullloop->addAction( new ActionReturnSplit("returnsplit") );
    actfullloop->addAction( new ActionUnjustifiedParams("protorecovery") );
    actfullloop->addAction( new ActionStartTypes("typerecovery") );
    actfullloop->addAction( new ActionActiveReturn("protorecovery") );
  }
  act->addAction( actfullloop );
  act->addAction( new ActionStartCleanUp("cleanup") );
  {
    actcleanup = new ActionPool(Action::rule_repeatapply,"cleanup");

    actcleanup->addRule( new RuleMultNegOne("cleanup") );
    actcleanup->addRule( new RuleAddUnsigned("cleanup") );
    actcleanup->addRule( new Rule2Comp2Sub("cleanup") );
    actcleanup->addRule( new RuleSubRight("cleanup") );
    actcleanup->addRule( new RulePtrsubCharConstant("cleanup") );
  }
  act->addAction( actcleanup );

  act->addAction( new ActionPreferComplement("blockrecovery") );
  act->addAction( new ActionNormalizeBranches("normalizebranches") );
  act->addAction( new ActionAssignHigh("merge") );
  act->addAction( new ActionMergeRequired("merge") );
  act->addAction( new ActionMarkExplicit("merge") );
  act->addAction( new ActionMarkImplied("merge") ); // This must come BEFORE general merging
  act->addAction( new ActionMergeCopy("merge") );
  act->addAction( new ActionDominantCopy("merge") );
  act->addAction( new ActionMarkIndirectOnly("merge") ); // Must come after required merges but before speculative
  act->addAction( new ActionMergeAdjacent("merge") );
  act->addAction( new ActionMergeType("merge") );
  act->addAction( new ActionHideShadow("merge") );
  act->addAction( new ActionCopyMarker("merge") );
  act->addAction( new ActionOutputPrototype("localrecovery") );
  act->addAction( new ActionInputPrototype("fixateproto") );
  act->addAction( new ActionRestructureHigh("localrecovery") );
  act->addAction( new ActionMapGlobals("fixateglobals") );
  act->addAction( new ActionDynamicSymbols("dynamic") );
  act->addAction( new ActionNameVars("merge") );
  act->addAction( new ActionSetCasts("casts") );
  act->addAction( new ActionFinalStructure("blockrecovery") );
  act->addAction( new ActionPrototypeWarnings("protorecovery") );
  act->addAction( new ActionStop("base") );
}